

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O3

void nk_glfw3_font_stash_begin(nk_font_atlas **atlas)

{
  memset(&glfw.atlas,0,400);
  glfw.atlas.temporary.alloc = nk_malloc;
  glfw.atlas.temporary.free = nk_mfree;
  glfw.atlas.permanent.alloc = nk_malloc;
  glfw.atlas.permanent.free = nk_mfree;
  nk_font_atlas_begin(&glfw.atlas);
  *atlas = &glfw.atlas;
  return;
}

Assistant:

NK_API void
nk_glfw3_font_stash_begin(struct nk_font_atlas **atlas)
{
    nk_font_atlas_init_default(&glfw.atlas);
    nk_font_atlas_begin(&glfw.atlas);
    *atlas = &glfw.atlas;
}